

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3VdbeMemStringify(Mem *pMem,u8 enc,u8 bForce)

{
  undefined2 uVar1;
  char *pcVar2;
  ushort uVar3;
  int iVar4;
  size_t sVar5;
  double dVar6;
  StrAccum local_40;
  
  iVar4 = sqlite3VdbeMemClearAndResize(pMem,0x20);
  if (iVar4 == 0) {
    pcVar2 = pMem->z;
    local_40.db = (sqlite3 *)0x0;
    local_40.nAlloc = 0x20;
    local_40.mxAlloc = 0;
    local_40.nChar = 0;
    local_40.accError = '\0';
    local_40.printfFlags = '\0';
    local_40.zText = pcVar2;
    if ((pMem->flags & 4) == 0) {
      if ((pMem->flags & 0x20) == 0) {
        dVar6 = (pMem->u).r;
      }
      else {
        dVar6 = (double)(pMem->u).i;
      }
      sqlite3_str_appendf(&local_40,"%!.15g",dVar6);
    }
    else {
      sqlite3_str_appendf(&local_40,"%lld",(pMem->u).r);
    }
    pcVar2[(ulong)local_40._20_8_ >> 0x20] = '\0';
    sVar5 = strlen(pMem->z);
    pMem->n = (uint)sVar5 & 0x3fffffff;
    pMem->enc = '\x01';
    uVar1 = pMem->flags;
    uVar3 = uVar1 & 0xffd3;
    if (bForce == '\0') {
      uVar3 = uVar1;
    }
    pMem->flags = uVar3 | 0x202;
    sqlite3VdbeChangeEncoding(pMem,(uint)enc);
    iVar4 = 0;
  }
  else {
    pMem->enc = '\0';
    iVar4 = 7;
  }
  return iVar4;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemStringify(Mem *pMem, u8 enc, u8 bForce){
  const int nByte = 32;

  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
  assert( !(pMem->flags&MEM_Zero) );
  assert( !(pMem->flags&(MEM_Str|MEM_Blob)) );
  assert( pMem->flags&(MEM_Int|MEM_Real|MEM_IntReal) );
  assert( !sqlite3VdbeMemIsRowSet(pMem) );
  assert( EIGHT_BYTE_ALIGNMENT(pMem) );


  if( sqlite3VdbeMemClearAndResize(pMem, nByte) ){
    pMem->enc = 0;
    return SQLITE_NOMEM_BKPT;
  }

  vdbeMemRenderNum(nByte, pMem->z, pMem);
  assert( pMem->z!=0 );
  pMem->n = sqlite3Strlen30NN(pMem->z);
  pMem->enc = SQLITE_UTF8;
  pMem->flags |= MEM_Str|MEM_Term;
  if( bForce ) pMem->flags &= ~(MEM_Int|MEM_Real|MEM_IntReal);
  sqlite3VdbeChangeEncoding(pMem, enc);
  return SQLITE_OK;
}